

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  TestCaseInfo *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__TestCaseStats_0021ed08;
  std::__cxx11::string::~string((string *)&in_RDI[1].field_0x48);
  std::__cxx11::string::~string((string *)&in_RDI[1].field_0x28);
  TestCaseInfo::~TestCaseInfo(in_RDI);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() {}